

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexagons.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  allocator<char> local_231;
  _InputArray local_230;
  _InputArray local_218;
  undefined8 uStack_200;
  undefined8 local_1f0;
  VideoCapture capture;
  undefined8 local_1b8;
  Mat frame;
  Mat dstImage;
  Mat imageHexagons;
  Mat local_90 [96];
  
  local_1b8 = 0x384000005a0;
  cv::Mat::Mat(&imageHexagons,&local_1b8,0x10);
  cVar1 = cv::Mat::empty();
  if (cVar1 == '\0') {
    cv::Mat::Mat(&dstImage);
    cv::Mat::Mat(&frame);
    cv::VideoCapture::VideoCapture(&capture);
    cv::VideoCapture::set((int)&capture,1440.0);
    cv::VideoCapture::set((int)&capture,900.0);
    cv::VideoCapture::open((int)&capture,0);
    cVar1 = cv::VideoCapture::isOpened();
    if (cVar1 == '\0') {
      std::operator<<((ostream *)&std::cerr,"ERROR! Unable to open camera\n");
      iVar2 = -1;
    }
    else {
      do {
        cv::VideoCapture::operator>>(&capture,&frame);
        cVar1 = cv::Mat::empty();
        if (cVar1 != '\0') {
          std::operator<<((ostream *)&std::cerr,"ERROR! blank frame grabbed\n");
          break;
        }
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_218);
        local_218.sz.width = 0;
        local_218.sz.height = 0;
        uStack_200 = 0;
        local_218.flags = 0;
        local_218._4_4_ = 0;
        local_218.obj = (void *)0x0;
        cv::Mat::operator=(&imageHexagons,(Scalar_ *)&local_218);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_218);
        local_218.sz.width = 0;
        local_218.sz.height = 0;
        uStack_200 = 0;
        local_218.flags = 0;
        local_218._4_4_ = 0;
        local_218.obj = (void *)0x0;
        cv::Mat::operator=(&dstImage,(Scalar_ *)&local_218);
        cv::Mat::Mat(local_90,&imageHexagons);
        drawHexagons(local_90,0xb);
        cv::Mat::~Mat(local_90);
        local_218.sz.width = 0;
        local_218.sz.height = 0;
        local_218.flags = 0x1010000;
        local_230.sz.width = 0;
        local_230.sz.height = 0;
        local_230.flags = 0x2010000;
        local_1f0 = 0x384000005a0;
        local_230.obj = &frame;
        local_218.obj = &frame;
        cv::resize(0,0,&local_218,&local_230,&local_1f0,2);
        local_218.sz.width = 0;
        local_218.sz.height = 0;
        local_230.sz.width = 0;
        local_230.sz.height = 0;
        local_218.flags = 0x2010000;
        local_230.flags = 0x1010000;
        local_230.obj = &imageHexagons;
        local_218.obj = &dstImage;
        cv::Mat::copyTo((_OutputArray *)&frame,&local_218);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Masked",&local_231)
        ;
        local_230.sz.width = 0;
        local_230.sz.height = 0;
        local_230.flags = 0x1010000;
        local_230.obj = &dstImage;
        cv::imshow((string *)&local_218,&local_230);
        std::__cxx11::string::~string((string *)&local_218);
        iVar2 = cv::waitKey(5);
      } while (iVar2 < 0);
      iVar2 = 0;
    }
    cv::VideoCapture::~VideoCapture(&capture);
    cv::Mat::~Mat(&frame);
    cv::Mat::~Mat(&dstImage);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"ERROR! Image cannot be created\n");
    iVar2 = -1;
  }
  cv::Mat::~Mat(&imageHexagons);
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) {
  Size imageSize(w, h);
  Mat imageHexagons(imageSize, CV_8UC3);

  if (imageHexagons.empty())
  {
    cerr << "ERROR! Image cannot be created\n";
    return -1;
  }

  Mat dstImage, frame;
  VideoCapture capture;
  int factorDefault = 11; // increase/decrease space between hexagons
  int deviceID = 0; // specify your video capture device
  int apiID = cv::CAP_ANY;

  capture.set(VideoCaptureProperties::CAP_PROP_FRAME_WIDTH, w);
  capture.set(VideoCaptureProperties::CAP_PROP_FRAME_HEIGHT, h);

  capture.open(deviceID, apiID);

  if (!capture.isOpened()) {
    cerr << "ERROR! Unable to open camera\n";
    return -1;
  }

  for (;;) {
    capture >> frame;

    if (frame.empty()) {
      cerr << "ERROR! blank frame grabbed\n";
      break;
    }

    imageHexagons = Scalar(0, 0, 0);
    dstImage = Scalar(0, 0, 0);

    drawHexagons(imageHexagons, factorDefault);
    resize(frame, frame, Size(w, h), 0, 0, INTER_CUBIC);
    frame.copyTo(dstImage, imageHexagons);
    imshow("Masked", dstImage);

    if (waitKey(5) >= 0)
      break;
  }

  return 0;
}